

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDynamicLoader.cxx
# Opt level: O1

int testDynamicLoader(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  string libname;
  char *local_60;
  undefined8 local_58;
  char local_50;
  undefined7 uStack_4f;
  int local_3c;
  int local_38;
  int local_34;
  
  if (argc == 3) {
    iVar1 = TestDynamicLoader(argv[1],argv[2],1,1,1);
    return iVar1;
  }
  local_34 = TestDynamicLoader("azerty_","foo_bar",0,0,0);
  iVar1 = TestDynamicLoader("/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/kwsys/testSystemTools.bin"
                            ,"wp",0,0,0);
  iVar2 = TestDynamicLoader("foobar.lib","dlopen",0,1,0);
  local_38 = TestDynamicLoader("libdl.so","dlopen",1,1,1);
  local_3c = TestDynamicLoader("libdl.so","TestDynamicLoader",1,0,1);
  local_60 = &local_50;
  local_58 = 0;
  local_50 = '\0';
  std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x13b6af);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  std::__cxx11::string::append((char *)&local_60);
  iVar3 = TestDynamicLoader(local_60,"dummy",1,0,1);
  iVar4 = TestDynamicLoader(local_60,"TestDynamicLoaderSymbolPointer",1,1,1);
  iVar5 = TestDynamicLoader(local_60,"_TestDynamicLoaderSymbolPointer",1,0,1);
  iVar6 = TestDynamicLoader(local_60,"TestDynamicLoaderData",1,1,1);
  iVar7 = TestDynamicLoader(local_60,"_TestDynamicLoaderData",1,0,1);
  iVar1 = iVar2 + local_38 + iVar1 + local_34 + local_3c;
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return iVar6 + iVar7 + iVar4 + iVar5 + iVar1 + iVar3;
}

Assistant:

int testDynamicLoader(int argc, char *argv[])
{
#if defined(_WIN32)
  SetErrorMode(SEM_FAILCRITICALERRORS | SEM_NOGPFAULTERRORBOX);
#elif defined(__BEOS__) || defined(__HAIKU__)
  disable_debugger(1);
#endif
  int res = 0;
  if( argc == 3 )
    {
    // User specify a libname and symbol to check.
    res = TestDynamicLoader(argv[1], argv[2],1,1,1);
    return res;
    }

// dlopen() on Syllable before 11/22/2007 doesn't return 0 on error
#ifndef __SYLLABLE__
  // Make sure that inexistent lib is giving correct result
  res += TestDynamicLoader("azerty_", "foo_bar",0,0,0);
  // Make sure that random binary file cannot be assimilated as dylib
  res += TestDynamicLoader(TEST_SYSTEMTOOLS_SOURCE_DIR "/testSystemTools.bin", "wp",0,0,0);
#endif

#ifdef __linux__
  // This one is actually fun to test, since dlopen is by default loaded...wonder why :)
  res += TestDynamicLoader("foobar.lib", "dlopen",0,1,0);
  res += TestDynamicLoader("libdl.so", "dlopen",1,1,1);
  res += TestDynamicLoader("libdl.so", "TestDynamicLoader",1,0,1);
#endif
  // Now try on the generated library
  std::string libname = GetLibName(KWSYS_NAMESPACE_STRING "TestDynload");
  res += TestDynamicLoader(libname.c_str(), "dummy",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderSymbolPointer",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderSymbolPointer",1,0,1);
  res += TestDynamicLoader(libname.c_str(), "TestDynamicLoaderData",1,1,1);
  res += TestDynamicLoader(libname.c_str(), "_TestDynamicLoaderData",1,0,1);

  return res;
}